

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O3

void __thiscall
hiberlite::bean_ptr<B>::hibernate<hiberlite::AVisitor<hiberlite::UpdateBean>>
          (bean_ptr<B> *this,AVisitor<hiberlite::UpdateBean> *ar)

{
  int *piVar1;
  shared_cnt_obj_pair<hiberlite::real_bean<B>_> *psVar2;
  real_bean<B> *prVar3;
  long lVar4;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar5;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar6;
  logic_error *this_00;
  sqlid_t *_value;
  bool bVar7;
  bean_key local_e8;
  bean_ptr<B> local_d0;
  string local_b8;
  string local_98;
  sql_nvp<long_long> local_78;
  
  psVar2 = (this->super_shared_res<hiberlite::real_bean<B>_>).res;
  if ((psVar2 == (shared_cnt_obj_pair<hiberlite::real_bean<B>_> *)0x0) ||
     (prVar3 = psVar2->res, prVar3 == (real_bean<B> *)0x0)) {
    this->tmp_id = -1;
  }
  else {
    lVar4 = (prVar3->key).id;
    psVar5 = (prVar3->key).con.res;
    if ((psVar5 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) && (psVar5->refCount == 0)
       ) {
      (*psVar5->_vptr_shared_cnt_obj_pair[1])();
    }
    this->tmp_id = lVar4;
    if (lVar4 != -1) {
      psVar5 = (ar->rootKey).con.res;
      if (psVar5 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        psVar5->refCount = psVar5->refCount + 1;
      }
      bVar7 = psVar5 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0;
      psVar6 = (((this->super_shared_res<hiberlite::real_bean<B>_>).res)->res->key).con.res;
      if ((psVar6 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) &&
         (bVar7 = psVar5 == (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0,
         psVar6->refCount == 0)) {
        (*psVar6->_vptr_shared_cnt_obj_pair[1])();
      }
      if (psVar5 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar1 = &psVar5->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*psVar5->_vptr_shared_cnt_obj_pair[1])(psVar5);
        }
      }
      if (bVar7) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"saving the bean from different database");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  _value = &this->tmp_id;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"id","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  sql_nvp<long_long>::sql_nvp(&local_78,&local_98,_value,&local_b8);
  AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.search_key._M_dataplus._M_p != &local_78.search_key.field_2) {
    operator_delete(local_78.search_key._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
    operator_delete(local_78.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (ar->purpose == 1) {
    psVar5 = (ar->rootKey).con.res;
    if (psVar5 == (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      local_e8.id = *_value;
      local_e8.con.res = (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0;
    }
    else {
      local_e8.id = *_value;
      psVar5->refCount = psVar5->refCount + 2;
      local_e8.con.res = psVar5;
    }
    local_e8.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
    Registry<B>::get(&local_d0,&local_e8);
    operator=(this,&local_d0);
    local_d0.super_shared_res<hiberlite::real_bean<B>_>._vptr_shared_res =
         (_func_int **)&PTR__shared_res_001d3488;
    if (local_d0.super_shared_res<hiberlite::real_bean<B>_>.res !=
        (shared_cnt_obj_pair<hiberlite::real_bean<B>_> *)0x0) {
      piVar1 = &(local_d0.super_shared_res<hiberlite::real_bean<B>_>.res)->refCount;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_d0.super_shared_res<hiberlite::real_bean<B>_>.res)->_vptr_shared_cnt_obj_pair[1])()
        ;
      }
    }
    local_e8.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
    if (local_e8.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      piVar1 = &(local_e8.con.res)->refCount;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_e8.con.res)->_vptr_shared_cnt_obj_pair[1])();
      }
    }
    if (psVar5 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      piVar1 = &psVar5->refCount;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*psVar5->_vptr_shared_cnt_obj_pair[1])(psVar5);
      }
    }
  }
  return;
}

Assistant:

void bean_ptr<C>::hibernate(Archive & ar)
{
	tmp_id=get_id();

	if(tmp_id!=Database::NULL_ID
			&& ar.getConnection()!=shared_res< real_bean<C> >::get_object()->get_key().con)
		throw std::logic_error("saving the bean from different database");

	ar & hiberlite::sql_nvp< sqlid_t > ("id", tmp_id );
	if(ar.is_loading())
		*this=Registry<C>::get( bean_key(ar.getConnection(), tmp_id) );
}